

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# variance_sse2.c
# Opt level: O2

void aom_highbd_comp_mask_pred_sse2
               (uint8_t *comp_pred8,uint8_t *pred8,int width,int height,uint8_t *ref8,int ref_stride
               ,uint8_t *mask,int mask_stride,int invert_mask)

{
  undefined8 *puVar1;
  undefined4 *puVar2;
  uint uVar3;
  long lVar4;
  ulong uVar5;
  ulong uVar6;
  undefined4 in_register_00000014;
  int iVar8;
  long lVar9;
  long lVar10;
  ulong uVar11;
  int x;
  long lVar12;
  undefined8 *puVar13;
  undefined4 extraout_XMM0_Da;
  undefined4 extraout_XMM0_Da_00;
  undefined4 extraout_XMM0_Da_01;
  undefined4 extraout_XMM0_Da_02;
  undefined4 extraout_XMM0_Da_03;
  undefined4 extraout_XMM0_Db;
  undefined4 extraout_XMM0_Db_00;
  undefined4 extraout_XMM0_Db_01;
  undefined4 extraout_XMM0_Db_02;
  undefined4 extraout_XMM0_Db_03;
  undefined4 extraout_XMM0_Dc;
  undefined4 extraout_XMM0_Dc_00;
  undefined4 extraout_XMM0_Dc_01;
  undefined4 extraout_XMM0_Dc_02;
  undefined4 extraout_XMM0_Dc_03;
  undefined4 extraout_XMM0_Dd;
  undefined4 extraout_XMM0_Dd_00;
  undefined4 extraout_XMM0_Dd_01;
  undefined4 extraout_XMM0_Dd_02;
  undefined4 extraout_XMM0_Dd_03;
  __m128i s0;
  __m128i s0_00;
  __m128i s0_01;
  __m128i s0_02;
  __m128i s1;
  __m128i s1_00;
  __m128i s1_01;
  __m128i s1_02;
  __m128i s1_03;
  __m128i a;
  __m128i a_00;
  __m128i a_01;
  __m128i a_02;
  __m128i a_03;
  __m128i alVar14;
  longlong lVar7;
  
  lVar7 = CONCAT44(in_register_00000014,width);
  puVar13 = (undefined8 *)((long)comp_pred8 * 2);
  uVar11 = (ulong)(uint)ref_stride;
  if (invert_mask == 0) {
    uVar11 = (ulong)(uint)width;
  }
  lVar4 = (long)mask_stride;
  lVar10 = (long)(int)uVar11;
  if (width == 8) {
    lVar10 = lVar10 * 2;
    iVar8 = 0;
    do {
      alVar14[1] = lVar10;
      alVar14[0] = (longlong)comp_pred8;
      s1_01[1] = lVar4;
      s1_01[0] = lVar7;
      a_01[1] = uVar11;
      a_01[0] = (longlong)ref8;
      alVar14 = highbd_comp_mask_pred_line_sse2(alVar14,s1_01,a_01);
      lVar7 = alVar14[1];
      *(undefined4 *)puVar13 = extraout_XMM0_Da_01;
      *(undefined4 *)((long)puVar13 + 4) = extraout_XMM0_Db_01;
      *(undefined4 *)(puVar13 + 1) = extraout_XMM0_Dc_01;
      *(undefined4 *)((long)puVar13 + 0xc) = extraout_XMM0_Dd_01;
      puVar13 = puVar13 + 2;
      iVar8 = iVar8 + 1;
    } while (iVar8 < height);
  }
  else if (width == 0x10) {
    lVar10 = lVar10 * 2;
    iVar8 = 0;
    do {
      s0[1] = lVar10;
      s0[0] = (longlong)comp_pred8;
      s1[1] = lVar4;
      s1[0] = lVar7;
      a[1] = uVar11;
      a[0] = (longlong)ref8;
      alVar14 = highbd_comp_mask_pred_line_sse2(s0,s1,a);
      s1_00[0] = alVar14[1];
      s0_00[1] = lVar10;
      s0_00[0] = (longlong)comp_pred8;
      s1_00[1] = lVar4;
      a_00[1] = uVar11;
      a_00[0] = (longlong)ref8;
      alVar14 = highbd_comp_mask_pred_line_sse2(s0_00,s1_00,a_00);
      lVar7 = alVar14[1];
      *puVar13 = CONCAT44(extraout_XMM0_Db,extraout_XMM0_Da);
      puVar13[1] = CONCAT44(extraout_XMM0_Dd,extraout_XMM0_Dc);
      *(undefined4 *)(puVar13 + 2) = extraout_XMM0_Da_00;
      *(undefined4 *)((long)puVar13 + 0x14) = extraout_XMM0_Db_00;
      *(undefined4 *)(puVar13 + 3) = extraout_XMM0_Dc_00;
      *(undefined4 *)((long)puVar13 + 0x1c) = extraout_XMM0_Dd_00;
      puVar13 = puVar13 + 4;
      iVar8 = iVar8 + 1;
    } while (iVar8 < height);
  }
  else {
    uVar5 = 0;
    do {
      uVar6 = uVar5;
      lVar4 = lVar10 * 2;
      for (lVar12 = 0; lVar12 < width; lVar12 = lVar12 + 0x20) {
        for (lVar9 = 0; lVar9 != 0x20; lVar9 = lVar9 + 0x10) {
          s0_01[1] = lVar4;
          s0_01[0] = (longlong)comp_pred8;
          s1_02[1] = uVar6;
          s1_02[0] = lVar7;
          a_02[1] = uVar11;
          a_02[0] = (longlong)ref8;
          alVar14 = highbd_comp_mask_pred_line_sse2(s0_01,s1_02,a_02);
          s1_03[0] = alVar14[1];
          s0_02[1] = lVar4;
          s0_02[0] = (longlong)comp_pred8;
          s1_03[1] = uVar6;
          a_03[1] = uVar11;
          a_03[0] = (longlong)ref8;
          alVar14 = highbd_comp_mask_pred_line_sse2(s0_02,s1_03,a_03);
          lVar7 = alVar14[1];
          puVar1 = (undefined8 *)((long)puVar13 + lVar9 * 2);
          *puVar1 = CONCAT44(extraout_XMM0_Db_02,extraout_XMM0_Da_02);
          puVar1[1] = CONCAT44(extraout_XMM0_Dd_02,extraout_XMM0_Dc_02);
          puVar2 = (undefined4 *)((long)puVar13 + lVar9 * 2 + 0x10);
          *puVar2 = extraout_XMM0_Da_03;
          puVar2[1] = extraout_XMM0_Db_03;
          puVar2[2] = extraout_XMM0_Dc_03;
          puVar2[3] = extraout_XMM0_Dd_03;
        }
        puVar13 = puVar13 + 8;
      }
      uVar3 = (int)uVar5 + 1;
      uVar5 = (ulong)uVar3;
    } while ((int)uVar3 < height);
  }
  return;
}

Assistant:

void aom_highbd_comp_mask_pred_sse2(uint8_t *comp_pred8, const uint8_t *pred8,
                                    int width, int height, const uint8_t *ref8,
                                    int ref_stride, const uint8_t *mask,
                                    int mask_stride, int invert_mask) {
  int i = 0;
  uint16_t *comp_pred = CONVERT_TO_SHORTPTR(comp_pred8);
  uint16_t *pred = CONVERT_TO_SHORTPTR(pred8);
  uint16_t *ref = CONVERT_TO_SHORTPTR(ref8);
  const uint16_t *src0 = invert_mask ? pred : ref;
  const uint16_t *src1 = invert_mask ? ref : pred;
  const int stride0 = invert_mask ? width : ref_stride;
  const int stride1 = invert_mask ? ref_stride : width;
  const __m128i zero = _mm_setzero_si128();

  if (width == 8) {
    do {
      const __m128i s0 = _mm_loadu_si128((const __m128i *)(src0));
      const __m128i s1 = _mm_loadu_si128((const __m128i *)(src1));
      const __m128i m_8 = _mm_loadl_epi64((const __m128i *)mask);
      const __m128i m_16 = _mm_unpacklo_epi8(m_8, zero);

      const __m128i comp = highbd_comp_mask_pred_line_sse2(s0, s1, m_16);

      _mm_storeu_si128((__m128i *)comp_pred, comp);

      src0 += stride0;
      src1 += stride1;
      mask += mask_stride;
      comp_pred += width;
      i += 1;
    } while (i < height);
  } else if (width == 16) {
    do {
      const __m128i s0 = _mm_loadu_si128((const __m128i *)(src0));
      const __m128i s2 = _mm_loadu_si128((const __m128i *)(src0 + 8));
      const __m128i s1 = _mm_loadu_si128((const __m128i *)(src1));
      const __m128i s3 = _mm_loadu_si128((const __m128i *)(src1 + 8));

      const __m128i m_8 = _mm_loadu_si128((const __m128i *)mask);
      const __m128i m01_16 = _mm_unpacklo_epi8(m_8, zero);
      const __m128i m23_16 = _mm_unpackhi_epi8(m_8, zero);

      const __m128i comp = highbd_comp_mask_pred_line_sse2(s0, s1, m01_16);
      const __m128i comp1 = highbd_comp_mask_pred_line_sse2(s2, s3, m23_16);

      _mm_storeu_si128((__m128i *)comp_pred, comp);
      _mm_storeu_si128((__m128i *)(comp_pred + 8), comp1);

      src0 += stride0;
      src1 += stride1;
      mask += mask_stride;
      comp_pred += width;
      i += 1;
    } while (i < height);
  } else {
    do {
      for (int x = 0; x < width; x += 32) {
        for (int j = 0; j < 2; j++) {
          const __m128i s0 =
              _mm_loadu_si128((const __m128i *)(src0 + x + j * 16));
          const __m128i s2 =
              _mm_loadu_si128((const __m128i *)(src0 + x + 8 + j * 16));
          const __m128i s1 =
              _mm_loadu_si128((const __m128i *)(src1 + x + j * 16));
          const __m128i s3 =
              _mm_loadu_si128((const __m128i *)(src1 + x + 8 + j * 16));

          const __m128i m_8 =
              _mm_loadu_si128((const __m128i *)(mask + x + j * 16));
          const __m128i m01_16 = _mm_unpacklo_epi8(m_8, zero);
          const __m128i m23_16 = _mm_unpackhi_epi8(m_8, zero);

          const __m128i comp = highbd_comp_mask_pred_line_sse2(s0, s1, m01_16);
          const __m128i comp1 = highbd_comp_mask_pred_line_sse2(s2, s3, m23_16);

          _mm_storeu_si128((__m128i *)(comp_pred + j * 16), comp);
          _mm_storeu_si128((__m128i *)(comp_pred + 8 + j * 16), comp1);
        }
        comp_pred += 32;
      }
      src0 += stride0;
      src1 += stride1;
      mask += mask_stride;
      i += 1;
    } while (i < height);
  }
}